

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void coins_tests::CheckAccessCoin
               (CAmount base_value,CAmount cache_value,CAmount expected_value,char cache_flags,
               char expected_flags)

{
  bool bVar1;
  const_string *file;
  undefined8 in_RSI;
  CAmount in_RDI;
  long in_FS_OFFSET;
  char result_flags;
  CAmount result_value;
  SingleEntryCacheTest test;
  char *in_stack_fffffffffffffb38;
  COutPoint *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  const_string *in_stack_fffffffffffffb60;
  const_string *msg;
  const_string *line_num;
  unit_test_log_t *in_stack_fffffffffffffb78;
  CAmount in_stack_fffffffffffffba0;
  SingleEntryCacheTest *in_stack_fffffffffffffba8;
  undefined1 local_450 [55];
  undefined1 in_stack_fffffffffffffbe7;
  CCoinsViewCacheTest *in_stack_fffffffffffffbe8;
  undefined1 local_410 [16];
  undefined1 local_400 [71];
  undefined1 local_3b9;
  undefined1 local_3b8 [15];
  undefined1 local_3a9 [929];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SingleEntryCacheTest::SingleEntryCacheTest
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_RDI,
             (char)((ulong)in_RSI >> 0x38));
  CCoinsViewCache::AccessCoin
            ((CCoinsViewCache *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::SelfTest
            (in_stack_fffffffffffffbe8,(bool)in_stack_fffffffffffffbe7);
  file = (const_string *)
         anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
                   ((CCoinsViewCacheTest *)in_stack_fffffffffffffb38);
  GetCoinsMapEntry((CCoinsMap *)in_stack_fffffffffffffb48,(CAmount *)in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb38,(COutPoint *)0x50d3e0);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb48,
               (pointer)in_stack_fffffffffffffb40,(unsigned_long)in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb78,file,(size_t)line_num,in_stack_fffffffffffffb60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb40,(char (*) [1])in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb48,
               (pointer)in_stack_fffffffffffffb40,(unsigned_long)in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb48 = "expected_value";
    in_stack_fffffffffffffb40 = (COutPoint *)(local_3a9 + 1);
    in_stack_fffffffffffffb38 = "result_value";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_400,local_410,0x292,1,2,local_3b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb48,
               (pointer)in_stack_fffffffffffffb40,(unsigned_long)in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb78,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb40,(char (*) [1])in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb48,
               (pointer)in_stack_fffffffffffffb40,(unsigned_long)in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb48 = "expected_flags";
    in_stack_fffffffffffffb40 = (COutPoint *)local_3a9;
    in_stack_fffffffffffffb38 = "result_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_450,&stack0xfffffffffffffba0,0x293,1,2,&local_3b9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SingleEntryCacheTest::~SingleEntryCacheTest((SingleEntryCacheTest *)in_stack_fffffffffffffb38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void CheckAccessCoin(CAmount base_value, CAmount cache_value, CAmount expected_value, char cache_flags, char expected_flags)
{
    SingleEntryCacheTest test(base_value, cache_value, cache_flags);
    test.cache.AccessCoin(OUTPOINT);
    test.cache.SelfTest(/*sanity_check=*/false);

    CAmount result_value;
    char result_flags;
    GetCoinsMapEntry(test.cache.map(), result_value, result_flags);
    BOOST_CHECK_EQUAL(result_value, expected_value);
    BOOST_CHECK_EQUAL(result_flags, expected_flags);
}